

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O2

t_namelist * namelist_append(t_namelist *listwas,char *s,int allowdup)

{
  _namelist *p_Var1;
  int iVar2;
  t_namelist *ptVar3;
  size_t sVar4;
  char *pcVar5;
  t_namelist *ptVar6;
  
  ptVar3 = (t_namelist *)getbytes(0x10);
  ptVar3->nl_next = (_namelist *)0x0;
  sVar4 = strlen(s);
  pcVar5 = (char *)getbytes(sVar4 + 1);
  ptVar3->nl_string = pcVar5;
  strcpy(pcVar5,s);
  sys_unbashfilename(ptVar3->nl_string,ptVar3->nl_string);
  p_Var1 = listwas;
  if (listwas != (t_namelist *)0x0) {
    do {
      ptVar6 = p_Var1;
      if ((allowdup == 0) && (iVar2 = strcmp(ptVar6->nl_string,s), iVar2 == 0)) {
        pcVar5 = ptVar3->nl_string;
        sVar4 = strlen(pcVar5);
        freebytes(pcVar5,sVar4 + 1);
        return listwas;
      }
      p_Var1 = ptVar6->nl_next;
    } while (ptVar6->nl_next != (_namelist *)0x0);
    ptVar6->nl_next = ptVar3;
    ptVar3 = listwas;
  }
  return ptVar3;
}

Assistant:

t_namelist *namelist_append(t_namelist *listwas, const char *s, int allowdup)
{
    t_namelist *nl, *nl2;
    nl2 = (t_namelist *)(getbytes(sizeof(*nl)));
    nl2->nl_next = 0;
    nl2->nl_string = (char *)getbytes(strlen(s) + 1);
    strcpy(nl2->nl_string, s);
    sys_unbashfilename(nl2->nl_string, nl2->nl_string);
    if (!listwas)
        return (nl2);
    else
    {
        for (nl = listwas; ;)
        {
            if (!allowdup && !strcmp(nl->nl_string, s))
            {
                freebytes(nl2->nl_string, strlen(nl2->nl_string) + 1);
                return (listwas);
            }
            if (!nl->nl_next)
                break;
            nl = nl->nl_next;
        }
        nl->nl_next = nl2;
    }
    return (listwas);
}